

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_operations.hpp
# Opt level: O3

rt_expression_interface<double> *
viennamath::simplify_impl<viennamath::rt_expression_interface<double>,double>
          (long *lhs,long *param_2)

{
  char cVar1;
  rt_vector_expr<viennamath::rt_expression_interface<double>_> *rhs;
  long lVar2;
  rt_expression_interface<double> *prVar3;
  _func_int **pp_Var4;
  _func_int **pp_Var5;
  _func_int **pp_Var6;
  _func_int *p_Var7;
  long *local_30;
  
  cVar1 = (**(code **)(*lhs + 0x40))();
  if (cVar1 == '\0') {
    cVar1 = (**(code **)(*param_2 + 0x40))(param_2);
    if (cVar1 != '\0') {
      p_Var7 = (_func_int *)(**(code **)(*param_2 + 0x48))(param_2);
      if (((double)p_Var7 == 0.0) && (!NAN((double)p_Var7))) goto LAB_001165c3;
      if (((double)p_Var7 == 1.0) && (!NAN((double)p_Var7))) {
        lVar2 = *lhs;
        goto LAB_001166c2;
      }
      prVar3 = (rt_expression_interface<double> *)operator_new(0x20);
      pp_Var4 = (_func_int **)(**(code **)(*lhs + 0x80))(lhs);
      pp_Var5 = (_func_int **)operator_new(8);
      *pp_Var5 = (_func_int *)&PTR__op_interface_0012f6d0;
      pp_Var6 = (_func_int **)operator_new(0x10);
      *pp_Var6 = (_func_int *)&PTR__rt_expression_interface_0012f3a0;
      pp_Var6[1] = p_Var7;
      prVar3->_vptr_rt_expression_interface = (_func_int **)&PTR__rt_binary_expr_0012f0d0;
      prVar3[1]._vptr_rt_expression_interface = pp_Var4;
      prVar3[2]._vptr_rt_expression_interface = pp_Var5;
      goto LAB_0011673f;
    }
    rhs = (rt_vector_expr<viennamath::rt_expression_interface<double>_> *)
          __dynamic_cast(lhs,&rt_expression_interface<double>::typeinfo,
                         &rt_vector_expr<viennamath::rt_expression_interface<double>>::typeinfo,0);
    lVar2 = __dynamic_cast(param_2,&rt_expression_interface<double>::typeinfo,
                           &rt_vector_expr<viennamath::rt_expression_interface<double>>::typeinfo,0)
    ;
    if (lVar2 != 0 && rhs != (rt_vector_expr<viennamath::rt_expression_interface<double>_> *)0x0) {
      operator*((rt_vector_expr<viennamath::rt_expression_interface<double>_> *)&local_30,rhs);
      prVar3 = (rt_expression_interface<double> *)(**(code **)(*local_30 + 0x10))();
      if (local_30 == (long *)0x0) {
        return prVar3;
      }
      (**(code **)(*local_30 + 8))();
      return prVar3;
    }
    prVar3 = (rt_expression_interface<double> *)operator_new(0x20);
    pp_Var4 = (_func_int **)(**(code **)(*lhs + 0x80))(lhs);
    pp_Var5 = (_func_int **)operator_new(8);
    *pp_Var5 = (_func_int *)&PTR__op_interface_0012f6d0;
    pp_Var6 = (_func_int **)(**(code **)(*param_2 + 0x80))(param_2);
  }
  else {
    p_Var7 = (_func_int *)(**(code **)(*lhs + 0x48))(lhs);
    if (((double)p_Var7 == 0.0) && (!NAN((double)p_Var7))) {
LAB_001165c3:
      prVar3 = (rt_expression_interface<double> *)operator_new(0x10);
      prVar3->_vptr_rt_expression_interface = (_func_int **)&PTR__rt_expression_interface_0012f3a0;
      prVar3[1]._vptr_rt_expression_interface = (_func_int **)0x0;
      return prVar3;
    }
    if (((double)p_Var7 == 1.0) && (!NAN((double)p_Var7))) {
      lVar2 = *param_2;
      lhs = param_2;
LAB_001166c2:
      prVar3 = (rt_expression_interface<double> *)(**(code **)(lVar2 + 0x80))(lhs);
      return prVar3;
    }
    prVar3 = (rt_expression_interface<double> *)operator_new(0x20);
    pp_Var4 = (_func_int **)operator_new(0x10);
    *pp_Var4 = (_func_int *)&PTR__rt_expression_interface_0012f3a0;
    pp_Var4[1] = p_Var7;
    pp_Var5 = (_func_int **)operator_new(8);
    *pp_Var5 = (_func_int *)&PTR__op_interface_0012f6d0;
    pp_Var6 = (_func_int **)(**(code **)(*param_2 + 0x80))(param_2);
  }
  prVar3->_vptr_rt_expression_interface = (_func_int **)&PTR__rt_binary_expr_0012f0d0;
  prVar3[1]._vptr_rt_expression_interface = pp_Var4;
  prVar3[2]._vptr_rt_expression_interface = pp_Var5;
LAB_0011673f:
  prVar3[3]._vptr_rt_expression_interface = pp_Var6;
  return prVar3;
}

Assistant:

InterfaceType * simplify_impl(const InterfaceType * lhs, op_mult<NumericT>, const InterfaceType * rhs)
  {
        if (lhs->is_constant())
        {
          NumericT val = lhs->unwrap();
          if (val == 0.0)
            return new rt_constant<NumericT, InterfaceType>(0.0);
          if (val == 1.0)
            return rhs->simplify();

          return new rt_binary_expr<InterfaceType>(new rt_constant<NumericT, InterfaceType>(val),
                                                   new op_binary<op_mult<NumericT>, InterfaceType>(),
                                                   rhs->simplify());
        }
        else if (rhs->is_constant())
        {
          NumericT val = rhs->unwrap();
          if (val == 0.0)
            return new rt_constant<NumericT, InterfaceType>(0.0);
          if (val == 1.0)
            return lhs->simplify();

          return new rt_binary_expr<InterfaceType>(lhs->simplify(),
                                                   new op_binary<op_mult<NumericT>, InterfaceType>(),
                                                   new rt_constant<NumericT, InterfaceType>(val));
        }

        rt_vector_expr<InterfaceType> const * lhs_vec = dynamic_cast<rt_vector_expr<InterfaceType> const *>(lhs);
        rt_vector_expr<InterfaceType> const * rhs_vec = dynamic_cast<rt_vector_expr<InterfaceType> const *>(rhs);

        if (lhs_vec != NULL && rhs_vec != NULL)
          return (*lhs_vec * *rhs_vec).get()->clone();

        return new rt_binary_expr<InterfaceType>(lhs->simplify(),
                                                 new op_binary<op_mult<NumericT>, InterfaceType>(),
                                                 rhs->simplify());
  }